

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManPrintCone(Gia_Man_t *p,Gia_Obj_t *pObj,int *pLeaves,int nLeaves,Vec_Int_t *vNodes)

{
  uint uVar1;
  int v;
  Gia_Obj_t *pObj_00;
  int i;
  ulong uVar2;
  ulong uVar3;
  
  vNodes->nSize = 0;
  uVar2 = 0;
  uVar3 = (ulong)(uint)nLeaves;
  if (nLeaves < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    Vec_IntPush(vNodes,pLeaves[uVar2]);
  }
  Gia_ManPrintCollect_rec(p,pObj,vNodes);
  uVar1 = Gia_ObjId(p,pObj);
  i = 0;
  printf("GIA logic cone for node %d:\n",(ulong)uVar1);
  while( true ) {
    if (vNodes->nSize <= i) {
      return;
    }
    v = Vec_IntEntry(vNodes,i);
    pObj_00 = Gia_ManObj(p,v);
    if (pObj_00 == (Gia_Obj_t *)0x0) break;
    Gia_ObjPrint(p,pObj_00);
    i = i + 1;
  }
  return;
}

Assistant:

void Gia_ManPrintCone( Gia_Man_t * p, Gia_Obj_t * pObj, int * pLeaves, int nLeaves, Vec_Int_t * vNodes )
{
    int i;
    Vec_IntClear( vNodes );
    for ( i = 0; i < nLeaves; i++ )
        Vec_IntPush( vNodes, pLeaves[i] );
    Gia_ManPrintCollect_rec( p, pObj, vNodes );
    printf( "GIA logic cone for node %d:\n", Gia_ObjId(p, pObj) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Gia_ObjPrint( p, pObj );
}